

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O1

void __thiscall
gmlc::containers::
StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
::freeAll(StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
          *this)

{
  long lVar1;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *puVar2;
  Filter *pFVar3;
  int jj;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  if (this->dataptr != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
    if (0 < (long)this->bsize) {
      lVar5 = (long)this->bsize + 1;
      do {
        puVar2 = this->dataptr[this->dataSlotIndex];
        pFVar3 = puVar2[lVar5 + -2]._M_t.
                 super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
                 super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
        if (pFVar3 != (Filter *)0x0) {
          (**(code **)((long)(pFVar3->super_Interface)._vptr_Interface + 8))();
        }
        puVar2[lVar5 + -2]._M_t.
        super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
        super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
        super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = (Filter *)0x0;
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
    if (0 < (long)this->dataSlotIndex) {
      operator_delete(this->dataptr[this->dataSlotIndex],0x100);
    }
    lVar5 = (long)this->dataSlotIndex;
    if (0 < (long)this->dataSlotIndex) {
      do {
        lVar1 = lVar5 + -1;
        lVar4 = 0x1f;
        do {
          puVar2 = this->dataptr[lVar1];
          pFVar3 = puVar2[lVar4]._M_t.
                   super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
                   super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
                   super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl;
          if (pFVar3 != (Filter *)0x0) {
            (**(code **)((long)(pFVar3->super_Interface)._vptr_Interface + 8))();
          }
          puVar2[lVar4]._M_t.
          super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
          super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
          super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = (Filter *)0x0;
          bVar6 = lVar4 != 0;
          lVar4 = lVar4 + -1;
        } while (bVar6);
        operator_delete(this->dataptr[lVar1],0x100);
        bVar6 = 1 < lVar5;
        lVar5 = lVar1;
      } while (bVar6);
    }
    if (this->dataSlotIndex == 0) {
      operator_delete(*this->dataptr,0x100);
    }
    if (0 < this->freeIndex) {
      lVar5 = 0;
      do {
        operator_delete(this->freeblocks[lVar5],0x100);
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->freeIndex);
    }
    if (this->freeblocks != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0
       ) {
      operator_delete__(this->freeblocks);
    }
    if (this->dataptr != (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
      operator_delete__(this->dataptr);
      return;
    }
  }
  return;
}

Assistant:

void freeAll()
        {
            if (dataptr != nullptr) {
                Allocator a;
                for (int jj = bsize - 1; jj >= 0;
                     --jj) {  // call destructors on the last block
                    dataptr[dataSlotIndex][jj].~X();
                }
                if (dataSlotIndex > 0) {
                    a.deallocate(dataptr[dataSlotIndex], blockSize);
                }
                // go in reverse order
                for (int ii = dataSlotIndex - 1; ii >= 0; --ii) {
                    for (int jj = blockSize - 1; jj >= 0;
                         --jj) {  // call destructors on the middle blocks
                        dataptr[ii][jj].~X();
                    }
                    a.deallocate(dataptr[ii], blockSize);
                }
                if (dataSlotIndex == 0) {
                    a.deallocate(dataptr[0], blockSize);
                }

                for (int ii = 0; ii < freeIndex; ++ii) {
                    a.deallocate(freeblocks[ii], blockSize);
                }
                // delete can handle a nullptr
                delete[] freeblocks;
                delete[] dataptr;
            }
        }